

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O1

el_action_t vi_change_case(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  wVar5 = L'\x06';
  if ((el->el_line).cursor < (el->el_line).lastchar) {
    cv_undo(el);
    wVar5 = L'\0';
    if (L'\0' < (el->el_state).argument) {
      do {
        wVar4 = *(el->el_line).cursor;
        iVar3 = iswupper(wVar4);
        if (iVar3 == 0) {
          iVar3 = iswlower(wVar4);
          if (iVar3 != 0) {
            wVar4 = towupper(wVar4);
            goto LAB_0011ec51;
          }
        }
        else {
          wVar4 = towlower(wVar4);
LAB_0011ec51:
          *(el->el_line).cursor = wVar4;
        }
        pwVar2 = (el->el_line).cursor;
        pwVar1 = pwVar2 + 1;
        (el->el_line).cursor = pwVar1;
        if ((el->el_line).lastchar <= pwVar1) {
          (el->el_line).cursor = pwVar2;
          re_fastaddc(el);
          break;
        }
        re_fastaddc(el);
        wVar5 = wVar5 + L'\x01';
      } while (wVar5 < (el->el_state).argument);
      wVar5 = L'\0';
    }
  }
  return (el_action_t)wVar5;
}

Assistant:

libedit_private el_action_t
vi_change_case(EditLine *el, wint_t c)
{
	int i;

	if (el->el_line.cursor >= el->el_line.lastchar)
		return CC_ERROR;
	cv_undo(el);
	for (i = 0; i < el->el_state.argument; i++) {

		c = *el->el_line.cursor;
		if (iswupper(c))
			*el->el_line.cursor = towlower(c);
		else if (iswlower(c))
			*el->el_line.cursor = towupper(c);

		if (++el->el_line.cursor >= el->el_line.lastchar) {
			el->el_line.cursor--;
			re_fastaddc(el);
			break;
		}
		re_fastaddc(el);
	}
	return CC_NORM;
}